

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equipartitionTest.cpp
# Opt level: O0

void __thiscall
OpenMD::Equipartition::Equipartition
          (Equipartition *this,SimInfo *info,string *filename,string *sele1,string *sele2)

{
  string *in_RDI;
  string *in_stack_00000030;
  string *in_stack_00000038;
  string *in_stack_00000040;
  SimInfo *in_stack_00000048;
  SequentialAnalyzer *in_stack_00000050;
  string *in_stack_ffffffffffffff68;
  SequentialAnalyzer *this_00;
  string local_68 [32];
  string local_48 [72];
  
  SequentialAnalyzer::SequentialAnalyzer
            (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
             in_stack_00000030);
  *(undefined ***)in_RDI = &PTR__Equipartition_00394998;
  this_00 = (SequentialAnalyzer *)&in_RDI[0x6a]._M_string_length;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x122615)
  ;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x12262b)
  ;
  getPrefix(in_RDI);
  std::operator+(in_RDI,(char *)this_00);
  SequentialAnalyzer::setOutputName(this_00,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

Equipartition::Equipartition(SimInfo* info, const std::string& filename,
                               const std::string& sele1,
                               const std::string& sele2) :
      SequentialAnalyzer(info, filename, sele1, sele2) {
    setOutputName(getPrefix(filename) + ".temp");
  }